

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

Connection * __thiscall
soul::PoolAllocator::
allocate<soul::AST::Connection,soul::AST::Context&,soul::InterpolationType&,soul::pool_ref<soul::AST::Connection::SharedEndpoint>&,soul::pool_ref<soul::AST::Connection::SharedEndpoint>&,soul::pool_ptr<soul::AST::Expression>&>
          (PoolAllocator *this,Context *args,InterpolationType *args_1,
          pool_ref<soul::AST::Connection::SharedEndpoint> *args_2,
          pool_ref<soul::AST::Connection::SharedEndpoint> *args_3,
          pool_ptr<soul::AST::Expression> *args_4)

{
  InterpolationType interpolation;
  InterpolationType *c;
  Context *this_00;
  SharedEndpoint *src;
  SharedEndpoint *dst;
  DestructorFn *pDVar1;
  _lambda_void___1_ local_5d [13];
  pool_ptr<soul::AST::Expression> local_50;
  Connection *local_48;
  Connection *newObject;
  PoolItem *newItem;
  pool_ptr<soul::AST::Expression> *args_local_4;
  pool_ref<soul::AST::Connection::SharedEndpoint> *args_local_3;
  pool_ref<soul::AST::Connection::SharedEndpoint> *args_local_2;
  InterpolationType *args_local_1;
  Context *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_4;
  args_local_4 = (pool_ptr<soul::AST::Expression> *)args_3;
  args_local_3 = args_2;
  args_local_2 = (pool_ref<soul::AST::Connection::SharedEndpoint> *)args_1;
  args_local_1 = (InterpolationType *)args;
  args_local = (Context *)this;
  newObject = (Connection *)allocateSpaceForObject(this,0x48);
  c = args_local_1;
  this_00 = &(newObject->super_ASTObject).context;
  interpolation = *(InterpolationType *)&args_local_2->object;
  src = pool_ref::operator_cast_to_SharedEndpoint_((pool_ref *)args_local_3);
  dst = pool_ref::operator_cast_to_SharedEndpoint_((pool_ref *)args_local_4);
  local_50.object = (Expression *)newItem->size;
  AST::Connection::Connection((Connection *)this_00,(Context *)c,interpolation,src,dst,&local_50);
  pool_ptr<soul::AST::Expression>::~pool_ptr(&local_50);
  local_48 = (Connection *)this_00;
  pDVar1 = allocate(soul::AST::Context&,soul::InterpolationType&,soul::pool_ref&,soul::pool_ref&,soul::pool_ptr&)
           ::{lambda(void*)#1}::operator_cast_to_function_pointer(local_5d);
  *(DestructorFn **)&(newObject->super_ASTObject).objectType = pDVar1;
  return local_48;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }